

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robust_deserialization_unit.c
# Opt level: O1

char * readfile(FILE *fp,size_t *bytes)

{
  size_t sVar1;
  char *__ptr;
  char *pcVar2;
  
  fseek((FILE *)fp,0,2);
  sVar1 = ftell((FILE *)fp);
  *bytes = sVar1;
  __ptr = (char *)malloc(sVar1);
  pcVar2 = (char *)0x0;
  if (__ptr != (char *)0x0) {
    rewind((FILE *)fp);
    sVar1 = fread(__ptr,1,*bytes,(FILE *)fp);
    pcVar2 = __ptr;
    if (*bytes != sVar1) {
      free(__ptr);
      pcVar2 = (char *)0x0;
    }
  }
  return pcVar2;
}

Assistant:

char* readfile(FILE* fp, size_t* bytes) {
    *bytes = filesize(fp);
    char* buf = (char*)malloc(*bytes);
    if (buf == NULL) return NULL;

    rewind(fp);

    size_t cnt = fread(buf, 1, *bytes, fp);
    if (*bytes != cnt) {
        free(buf);
        return NULL;
    }
    return buf;
}